

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O1

void dasm_free(BuildCtx *ctx)

{
  dasm_State *__ptr;
  int **ppiVar1;
  long lVar2;
  
  __ptr = ctx->D;
  if (0 < __ptr->maxsection) {
    ppiVar1 = &__ptr->sections[0].buf;
    lVar2 = 0;
    do {
      if (*ppiVar1 != (int *)0x0) {
        free(*ppiVar1);
      }
      lVar2 = lVar2 + 1;
      ppiVar1 = ppiVar1 + 5;
    } while (lVar2 < __ptr->maxsection);
  }
  if (__ptr->pclabels != (int *)0x0) {
    free(__ptr->pclabels);
  }
  if (__ptr->lglabels != (int *)0x0) {
    free(__ptr->lglabels);
  }
  free(__ptr);
  return;
}

Assistant:

void dasm_free(Dst_DECL)
{
  dasm_State *D = Dst_REF;
  int i;
  for (i = 0; i < D->maxsection; i++)
    if (D->sections[i].buf)
      DASM_M_FREE(Dst, D->sections[i].buf, D->sections[i].bsize);
  if (D->pclabels) DASM_M_FREE(Dst, D->pclabels, D->pcsize);
  if (D->lglabels) DASM_M_FREE(Dst, D->lglabels, D->lgsize);
  DASM_M_FREE(Dst, D, D->psize);
}